

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cc
# Opt level: O0

Scalar<int> * __thiscall iqxmlrpc::Value::cast<iqxmlrpc::Scalar<int>>(Value *this)

{
  Bad_cast *this_00;
  Scalar<int> *local_38;
  Scalar<int> *t;
  Value *this_local;
  
  if (this->value == (Value_type *)0x0) {
    local_38 = (Scalar<int> *)0x0;
  }
  else {
    local_38 = (Scalar<int> *)
               __dynamic_cast(this->value,&Value_type::typeinfo,&Scalar<int>::typeinfo,0);
  }
  if (local_38 == (Scalar<int> *)0x0) {
    this_00 = (Bad_cast *)__cxa_allocate_exception(0x18);
    Bad_cast::Bad_cast(this_00);
    __cxa_throw(this_00,&Bad_cast::typeinfo,Bad_cast::~Bad_cast);
  }
  return local_38;
}

Assistant:

T* Value::cast() const
{
  T* t = dynamic_cast<T*>( value );
  if( !t )
    throw Bad_cast();
  return t;
}